

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

char * sfts_timestamp(char *ts)

{
  size_t sVar1;
  char *in_RDI;
  size_t l;
  
  if (((in_RDI != (char *)0x0) && (sVar1 = strlen(in_RDI), sVar1 != 0)) &&
     (in_RDI[sVar1 - 1] == 'Z')) {
    in_RDI[sVar1 - 1] = '\0';
  }
  return in_RDI;
}

Assistant:

char *sfts_timestamp(char *ts) {
    size_t l;

    if (!ts)
        return ts;
    if ((l = strlen(ts)) && ts[l - 1] == 'Z')
        ts[l - 1] = 0;
    return ts;
}